

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::Material::readFrom(Material *this,BinaryReader *binary)

{
  BinaryReader *in_RDI;
  string local_30 [40];
  
  BinaryReader::read<std::__cxx11::string>(in_RDI);
  std::__cxx11::string::operator=((string *)&in_RDI->currentEntityOffset,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Material::readFrom(BinaryReader &binary) 
  {
    name = binary.read<std::string>();
    /*! \todo serialize materials (can only do once mateirals are fleshed out) */
  }